

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O3

Vec_Str_t * Super_WriteLibraryTreeStr(Super_Man_t *pMan)

{
  uint uVar1;
  uint uVar2;
  Vec_Str_t *vStr;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  Super_Gate_t_conflict *pSVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int Counter;
  char pInsert [16];
  uint local_4c;
  char local_48 [24];
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar3 = (char *)malloc(1000);
  vStr->pArray = pcVar3;
  Super_WriteFileHeaderStr(pMan,vStr);
  uVar1 = vStr->nSize;
  iVar8 = 9;
  uVar7 = (ulong)uVar1;
  do {
    iVar9 = (int)uVar7;
    if (iVar9 == vStr->nCap) {
      if (iVar9 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc(0x10);
        }
        else {
          pcVar3 = (char *)realloc(vStr->pArray,0x10);
        }
        vStr->pArray = pcVar3;
        vStr->nCap = 0x10;
      }
      else {
        uVar2 = iVar9 * 2;
        if (vStr->pArray == (char *)0x0) {
          pcVar3 = (char *)malloc((ulong)uVar2);
        }
        else {
          pcVar3 = (char *)realloc(vStr->pArray,(ulong)uVar2);
        }
        vStr->pArray = pcVar3;
        vStr->nCap = uVar2;
      }
    }
    else {
      pcVar3 = vStr->pArray;
    }
    iVar9 = vStr->nSize;
    vStr->nSize = iVar9 + 1;
    pcVar3[iVar9] = ' ';
    uVar2 = vStr->nSize;
    uVar7 = (ulong)uVar2;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  if (uVar2 == vStr->nCap) {
    if ((int)uVar2 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = 0x10;
    }
    else {
      sVar5 = uVar7 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar5);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,sVar5);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = (int)sVar5;
    }
  }
  else {
    pcVar3 = vStr->pArray;
  }
  iVar8 = vStr->nSize;
  vStr->nSize = iVar8 + 1;
  pcVar3[iVar8] = '\n';
  if (pMan->nGates < 1) {
    local_4c = pMan->nVarsMax;
  }
  else {
    pSVar6 = *pMan->pGates;
    if (pSVar6 == (Super_Gate_t_conflict *)0x0) {
      local_4c = pMan->nVarsMax;
    }
    else {
      lVar4 = 1;
      do {
        pSVar6->field_0x8 = pSVar6->field_0x8 | 2;
        if (pMan->nGates <= lVar4) break;
        pSVar6 = pMan->pGates[lVar4];
        lVar4 = lVar4 + 1;
      } while (pSVar6 != (Super_Gate_t_conflict *)0x0);
      local_4c = pMan->nVarsMax;
      if (pMan->nGates < 1) goto LAB_003e80da;
    }
    lVar4 = 0;
    do {
      if (pMan->pGates[lVar4] == (Super_Gate_t_conflict *)0x0) break;
      Super_WriteLibraryTreeStr_rec(vStr,pMan,pMan->pGates[lVar4],(int *)&local_4c);
      lVar4 = lVar4 + 1;
    } while (lVar4 < pMan->nGates);
  }
LAB_003e80da:
  uVar2 = vStr->nSize;
  if (uVar2 == vStr->nCap) {
    if ((int)uVar2 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = 0x10;
    }
    else {
      sVar5 = (ulong)uVar2 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar5);
      }
      else {
        pcVar3 = (char *)realloc(vStr->pArray,sVar5);
      }
      vStr->pArray = pcVar3;
      vStr->nCap = (int)sVar5;
    }
  }
  else {
    pcVar3 = vStr->pArray;
  }
  iVar8 = vStr->nSize;
  vStr->nSize = iVar8 + 1;
  pcVar3[iVar8] = '\0';
  sprintf(local_48,"%d",(ulong)local_4c);
  sVar5 = strlen(local_48);
  if (0 < (int)(uint)sVar5) {
    uVar7 = 0;
    do {
      if (((int)uVar1 < 0) || (vStr->nSize <= (int)(uVar1 + (int)uVar7))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      vStr->pArray[uVar7 + uVar1] = local_48[uVar7];
      uVar7 = uVar7 + 1;
    } while (((uint)sVar5 & 0x7fffffff) != uVar7);
  }
  return vStr;
}

Assistant:

Vec_Str_t * Super_WriteLibraryTreeStr( Super_Man_t * pMan )
{
    char pInsert[16];
    Vec_Str_t * vStr;
    Super_Gate_t * pSuper;
    int i, Counter;
    int posStart;
     // write the elementary variables
    vStr = Vec_StrAlloc( 1000 );
    Super_WriteFileHeaderStr( pMan, vStr );
    // write the place holder for the number of lines
    posStart = Vec_StrSize( vStr );
    for ( i = 0; i < 9; i++ )
        Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '\n' );
    // mark the real supergates
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        pSuper->fSuper = 1;
    // write the supergates
    Counter = pMan->nVarsMax;
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        Super_WriteLibraryTreeStr_rec( vStr, pMan, pSuper, &Counter );
    Vec_StrPush( vStr, 0 );
    // write the number of lines
    sprintf( pInsert, "%d", Counter );
    for ( i = 0; i < (int)strlen(pInsert); i++ )
        Vec_StrWriteEntry( vStr, posStart + i, pInsert[i] );
    return vStr;
}